

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewScopeLayer.cpp
# Opt level: O0

void __thiscall NewScopeLayer::NewScopeLayer(NewScopeLayer *this)

{
  allocator<char> local_11;
  NewScopeLayer *local_10;
  NewScopeLayer *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"__GLOBAL__",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->parent_ = (NewScopeLayer *)0x0;
  std::vector<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>::vector(&this->children_);
  memset(&this->class_symbol_,0,0x20);
  Symbol::Symbol(&this->class_symbol_);
  memset(&this->method_symbol_,0,0x20);
  Symbol::Symbol(&this->method_symbol_);
  this->traverse_index = 0;
  std::
  unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
  ::unordered_map(&this->variables_);
  std::
  unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
  ::unordered_map(&this->arrays_);
  std::
  unordered_map<Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->user_type_system_);
  std::
  unordered_map<Symbol,_int,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_int>_>_>
  ::unordered_map(&this->symbol_types_);
  return;
}

Assistant:

NewScopeLayer::NewScopeLayer()
    : parent_(nullptr),
      name_("__GLOBAL__"),
      class_symbol_(),
      method_symbol_(),
      traverse_index(0) {}